

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvers.cpp
# Opt level: O1

vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
* getPredefinedTransformations1M1Q<double>
            (vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
             *__return_storage_ptr__,Matrix<double,_6,_1,_0,_6,_1> *l1,
            Matrix<double,_6,_1,_0,_6,_1> *l2)

{
  long lVar1;
  pointer pMVar2;
  iterator __position;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  ulong uVar8;
  uint uVar9;
  undefined4 uVar10;
  uint uVar11;
  long lVar12;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *pCVar13;
  double *pdVar14;
  Matrix<double,_4,_4,_0,_4,_4> *pMVar15;
  pointer pMVar16;
  iterator iVar17;
  PointerType ptr_1;
  PointerType ptr;
  byte bVar18;
  undefined1 auVar19 [16];
  double dVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  RealScalar z;
  double dVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  double dVar29;
  undefined1 auVar30 [16];
  double dVar31;
  double dVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  double dVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  double dVar39;
  Matrix<double,_4,_4,_0,_4,_4> TU1;
  Matrix<double,_4,_4,_0,_4,_4> TU2;
  Matrix<double,_3,_1,_0,_3,_1> ey;
  Matrix<double,_3,_1,_0,_3,_1> ex;
  Matrix<double,_4,_4,_0,_4,_4> Tu2;
  Matrix<double,_4,_4,_0,_4,_4> Tu1;
  Matrix<double,_6,_6,_0,_6,_6> TuL2;
  Matrix<double,_6,_6,_0,_6,_6> TuL1;
  Matrix<double,_4,_4,_0,_4,_4> TU;
  Matrix<double,_4,_4,_0,_4,_4> TU_B;
  Matrix<double,_3,_3,_0,_3,_3> U2;
  Matrix<double,_3,_3,_0,_3,_3> U1;
  double local_7f8;
  undefined8 uStack_7f0;
  Matrix<double,_3,_3,_0,_3,_3> local_7e8;
  double dStack_7a0;
  double local_798;
  double dStack_790;
  double dStack_788;
  double local_780;
  undefined8 uStack_778;
  undefined8 local_770;
  double local_768;
  undefined8 uStack_760;
  double local_758;
  undefined8 uStack_750;
  double local_748;
  undefined8 uStack_740;
  double local_738;
  undefined8 uStack_730;
  double local_728;
  undefined8 uStack_720;
  double local_718;
  undefined8 uStack_710;
  double local_708;
  double dStack_700;
  double local_6f8;
  undefined8 uStack_6f0;
  undefined1 local_6e8 [16];
  double local_6d8 [2];
  Scalar local_6c8;
  double adStack_6c0 [15];
  Matrix<double,_3,_1,_0,_3,_1> local_648;
  Matrix<double,_3,_1,_0,_3,_1> local_630;
  double local_618;
  double dStack_610;
  double local_608;
  double dStack_600;
  double local_5f8;
  double dStack_5f0;
  double local_5e8;
  double dStack_5e0;
  double local_5d8;
  double dStack_5d0;
  double local_5c8;
  undefined8 uStack_5c0;
  double local_5b8;
  double dStack_5b0;
  double local_5a8;
  undefined8 uStack_5a0;
  double local_598;
  double dStack_590;
  double local_588;
  undefined8 uStack_580;
  double local_578;
  double dStack_570;
  double local_568;
  double dStack_560;
  double local_558 [31];
  ulong local_460;
  undefined8 local_458;
  undefined8 uStack_450;
  double dStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 local_430;
  double dStack_428;
  double local_420;
  double local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  double local_3f8;
  double dStack_3f0;
  double local_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 local_3d0;
  double dStack_3c8;
  double local_3c0;
  double dStack_3b8;
  undefined8 local_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  double local_398;
  double dStack_390;
  double local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 local_370;
  double dStack_368;
  double local_360;
  double dStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  ulong local_340;
  double local_338;
  ulong uStack_330;
  double dStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 local_310;
  double dStack_308;
  double local_300;
  double local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  double local_2d8;
  double dStack_2d0;
  double local_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 local_2b0;
  double dStack_2a8;
  double local_2a0;
  double dStack_298;
  undefined8 local_290;
  undefined8 local_288;
  undefined8 uStack_280;
  double local_278;
  double dStack_270;
  double local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 local_250;
  double dStack_248;
  double local_240;
  double dStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  Matrix<double,_4,_4,_0,_4,_4> local_218;
  Matrix<double,_3,_1,_0,_3,_1> local_198;
  Matrix<double,_3,_1,_0,_3,_1> local_178;
  Matrix<double,_4,_4,_0,_4,_4> local_158;
  double local_d0;
  double dStack_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  double dStack_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  
  bVar18 = 0;
  dVar31 = (l1->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [0];
  dVar32 = (l1->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [1];
  dVar23 = (l1->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [2];
  dVar39 = (l1->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [3];
  dVar3 = (l1->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [4];
  dVar29 = (l1->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [5];
  dVar4 = (l2->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  dVar5 = (l2->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  dVar20 = (l2->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [2];
  dVar6 = (l2->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [3];
  dVar7 = (l2->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [4];
  dVar35 = (l2->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [5];
  local_558[0x1c] = dVar32 * dVar29 - dVar3 * dVar23;
  local_558[0x1d] = dVar23 * dVar39 - dVar29 * dVar31;
  local_558[0x1e] = dVar31 * dVar3 - dVar32 * dVar39;
  local_7f8 = dVar5 * dVar35 - dVar7 * dVar20;
  uStack_7f0 = dVar20 * dVar6 - dVar35 * dVar4;
  dVar35 = dVar4 * dVar7 - dVar5 * dVar6;
  dVar29 = dVar23 * local_558[0x1e] + local_558[0x1d] * dVar32 + local_558[0x1c] * dVar31;
  local_558[0x1c] = local_558[0x1c] - dVar29 * dVar31;
  local_558[0x1d] = local_558[0x1d] - dVar29 * dVar32;
  local_558[0x1e] = local_558[0x1e] - dVar23 * dVar29;
  dVar23 = dVar20 * dVar35 + uStack_7f0 * dVar5 + local_7f8 * dVar4;
  local_7f8 = local_7f8 - dVar23 * dVar4;
  uStack_7f0 = uStack_7f0 - dVar23 * dVar5;
  dVar35 = dVar35 - dVar20 * dVar23;
  local_558[0x10] = 1.0;
  local_558[0x11] = 0.0;
  local_558[0x12] = 0.0;
  local_558[0x13] = 0.0;
  local_558[0x14] = 0.0;
  local_558[0x15] = 1.0;
  local_558[0x16] = 0.0;
  local_558[0x17] = 0.0;
  local_558[0x18] = 0.0;
  local_558[0x19] = 0.0;
  local_558[0x1a] = 1.0;
  local_558[0x1b] = 0.0;
  local_460 = 0x3ff0000000000000;
  local_558[0] = 1.0;
  local_558[1] = 0.0;
  local_558[2] = 0.0;
  local_558[3] = 0.0;
  local_558[4] = 0.0;
  local_558[5] = 1.0;
  local_558[6] = 0.0;
  local_558[7] = 0.0;
  local_558[8] = 0.0;
  local_558[9] = 0.0;
  local_558[10] = 1.0;
  local_558[0xb] = 0.0;
  local_558[0xf] = 1.0;
  local_338 = 1.0;
  uStack_330 = 0;
  dStack_328 = 0.0;
  local_320 = 0;
  uStack_318 = 0;
  local_310 = 0;
  dStack_308 = 0.0;
  local_300 = 1.0;
  local_2f8 = 0.0;
  uStack_2f0 = 0;
  local_2e8 = 0;
  uStack_2e0 = 0;
  local_2d8 = 0.0;
  dStack_2d0 = 0.0;
  local_2c8 = 1.0;
  local_2c0 = 0;
  uStack_2b8 = 0;
  local_2b0 = 0;
  dStack_2a8 = 0.0;
  local_2a0 = 0.0;
  dStack_298 = 0.0;
  local_290 = 0x3ff0000000000000;
  local_288 = 0;
  uStack_280 = 0;
  local_278 = 0.0;
  dStack_270 = 0.0;
  local_268 = 0.0;
  uStack_260 = 0;
  local_258 = 0x3ff0000000000000;
  local_230 = 0;
  uStack_228 = 0;
  local_240 = 0.0;
  dStack_238 = 0.0;
  local_250 = 0;
  dStack_248 = 0.0;
  local_220 = 0x3ff0000000000000;
  local_458 = 1.0;
  uStack_450 = 0.0;
  dStack_448 = 0.0;
  local_440 = 0;
  uStack_438 = 0;
  local_430 = 0;
  dStack_428 = 0.0;
  local_420 = 1.0;
  local_418 = 0.0;
  uStack_410 = 0;
  local_408 = 0;
  uStack_400 = 0;
  local_3f8 = 0.0;
  dStack_3f0 = 0.0;
  local_3e8 = 1.0;
  local_3e0 = 0;
  uStack_3d8 = 0;
  local_3d0 = 0;
  dStack_3c8 = 0.0;
  local_3c0 = 0.0;
  dStack_3b8 = 0.0;
  local_3b0 = 0x3ff0000000000000;
  local_3a8 = 0;
  uStack_3a0 = 0;
  local_398 = 0.0;
  dStack_390 = 0.0;
  local_388 = 0.0;
  uStack_380 = 0;
  local_378 = 0x3ff0000000000000;
  local_350 = 0;
  uStack_348 = 0;
  local_360 = 0.0;
  dStack_358 = 0.0;
  local_370 = 0;
  dStack_368 = 0.0;
  local_340 = 0x3ff0000000000000;
  local_558[0xc] = local_7f8;
  local_558[0xd] = uStack_7f0;
  local_558[0xe] = dVar35;
  local_178.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       local_558[0x1c];
  local_178.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       local_558[0x1d];
  local_178.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       local_558[0x1e];
  getSkew<double>(&local_7e8,&local_178);
  lVar12 = 0x10;
  do {
    *(ulong *)((long)&local_340 + lVar12 * 2) =
         *(ulong *)((long)&local_7f8 + lVar12) ^ 0x8000000000000000;
    uVar8 = *(ulong *)((long)local_7e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                             m_storage.m_data.array + lVar12);
    *(ulong *)((long)&local_338 + lVar12 * 2) =
         *(ulong *)((long)&uStack_7f0 + lVar12) ^ 0x8000000000000000;
    *(ulong *)((long)&uStack_330 + lVar12 * 2) = uVar8 ^ 0x8000000000000000;
    lVar12 = lVar12 + 0x18;
  } while (lVar12 != 0x58);
  local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       local_7f8;
  local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       uStack_7f0;
  local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       dVar35;
  getSkew<double>(&local_7e8,&local_198);
  lVar12 = 0x10;
  do {
    *(ulong *)((long)&local_460 + lVar12 * 2) =
         *(ulong *)((long)&local_7f8 + lVar12) ^ 0x8000000000000000;
    uVar9 = *(uint *)((long)&uStack_7f0 + lVar12 + 4);
    uVar10 = *(undefined4 *)
              ((long)local_7e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                     m_storage.m_data.array + lVar12);
    uVar11 = *(uint *)((long)local_7e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                             m_storage.m_data.array + lVar12 + 4);
    lVar1 = lVar12 * 2;
    *(undefined4 *)((long)&local_458 + lVar1) = *(undefined4 *)((long)&uStack_7f0 + lVar12);
    *(uint *)((long)&local_458 + lVar1 + 4) = uVar9 ^ 0x80000000;
    *(undefined4 *)((long)&uStack_450 + lVar1) = uVar10;
    *(uint *)((long)&uStack_450 + lVar1 + 4) = uVar11 ^ 0x80000000;
    lVar12 = lVar12 + 0x18;
  } while (lVar12 != 0x58);
  local_6d8[0] = (l1->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data
                 .array[0];
  local_718 = (l1->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.
              array[1];
  local_6e8._0_8_ = local_6d8[0] * local_338;
  local_6e8._8_8_ = local_6d8[0] * (double)uStack_330;
  local_568 = local_718 * dStack_308;
  dStack_560 = local_718 * local_300;
  local_728 = (l1->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.
              array[2];
  local_578 = local_728 * local_2d8;
  dStack_570 = local_728 * dStack_2d0;
  local_738 = (l1->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.
              array[3];
  local_598 = local_738 * dStack_2a8;
  dStack_590 = local_738 * local_2a0;
  local_748 = (l1->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.
              array[4];
  local_5b8 = local_748 * local_278;
  dStack_5b0 = local_748 * dStack_270;
  local_758 = (l1->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.
              array[5];
  local_5d8 = local_758 * dStack_248;
  dStack_5d0 = local_758 * local_240;
  local_7f8 = (l2->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.
              array[0];
  local_768 = (l2->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.
              array[1];
  dVar23 = local_7f8 * local_458;
  dVar29 = local_7f8 * uStack_450;
  local_5e8 = local_768 * dStack_428;
  dStack_5e0 = local_768 * local_420;
  local_588 = (l2->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.
              array[2];
  local_5f8 = local_588 * local_3f8;
  dStack_5f0 = local_588 * dStack_3f0;
  local_5a8 = (l2->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.
              array[3];
  local_608 = local_5a8 * dStack_3c8;
  dStack_600 = local_5a8 * local_3c0;
  local_5c8 = (l2->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.
              array[4];
  local_618 = local_5c8 * local_398;
  dStack_610 = local_5c8 * dStack_390;
  local_6f8 = (l2->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.
              array[5];
  local_708 = local_6f8 * dStack_368;
  dStack_700 = local_6f8 * local_360;
  local_6d8[0] = local_6d8[0] * dStack_328;
  local_6d8[1] = 0.0;
  local_718 = local_718 * local_2f8;
  uStack_710 = 0;
  local_728 = local_728 * local_2c8;
  uStack_720 = 0;
  local_738 = local_738 * dStack_298;
  uStack_730 = 0;
  local_748 = local_748 * local_268;
  uStack_740 = 0;
  local_758 = local_758 * dStack_238;
  uStack_750 = 0;
  local_7f8 = local_7f8 * dStack_448;
  uStack_7f0 = 0.0;
  local_768 = local_768 * local_418;
  uStack_760 = 0;
  local_588 = local_588 * local_3e8;
  uStack_580 = 0;
  local_5a8 = local_5a8 * dStack_3b8;
  uStack_5a0 = 0;
  local_5c8 = local_5c8 * local_388;
  uStack_5c0 = 0;
  local_6f8 = local_6f8 * dStack_358;
  uStack_6f0 = 0;
  local_7e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       (double)&local_630;
  local_7e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
       0.0;
  local_7e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       4.94065645841247e-324;
  local_7e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
       4.94065645841247e-324;
  local_630.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       1.0;
  local_6c8 = 0.0;
  pCVar13 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                      ((CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_7e8,
                       &local_6c8);
  local_218.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
       0.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
            (pCVar13,(Scalar *)&local_218);
  if (((long)local_7e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[3] +
       (long)local_7e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[1] == 3) &&
     (local_7e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [2] == 4.94065645841247e-324)) {
    local_7e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0]
         = (double)&local_648;
    local_7e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1]
         = 0.0;
    local_7e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2]
         = 4.94065645841247e-324;
    local_7e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3]
         = 4.94065645841247e-324;
    local_648.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         = 0.0;
    local_6c8 = 1.0;
    pCVar13 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                        ((CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_7e8,
                         &local_6c8);
    local_218.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0]
         = 0.0;
    Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
              (pCVar13,(Scalar *)&local_218);
    if (((long)local_7e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[3] +
         (long)local_7e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[1] == 3) &&
       (local_7e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[2] == 4.94065645841247e-324)) {
      local_6e8._0_8_ =
           (double)local_6e8._0_8_ + local_568 + local_578 + local_598 + local_5b8 + local_5d8;
      local_6e8._8_8_ =
           (double)local_6e8._8_8_ + dStack_560 + dStack_570 + dStack_590 + dStack_5b0 + dStack_5d0;
      local_6d8[0] = local_6d8[0] + local_718 + local_728 + local_738 + local_748 + local_758;
      local_7f8 = local_7f8 + local_768 + local_588 + local_5a8 + local_5c8;
      local_738 = -local_648.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                   m_data.array[2];
      uStack_730 = 0x8000000000000000;
      auVar38._0_8_ =
           local_648.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[1] * local_6d8[0] -
           (double)local_6e8._8_8_ *
           local_648.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[2];
      dVar35 = local_648.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[2] * (double)local_6e8._0_8_ -
               local_6d8[0] *
               local_648.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[0];
      auVar38._8_8_ = dVar35;
      dVar20 = local_648.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[0] * (double)local_6e8._8_8_ -
               (double)local_6e8._0_8_ *
               local_648.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[1];
      auVar25._0_8_ =
           local_630.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[1] * local_6d8[0] -
           (double)local_6e8._8_8_ *
           local_630.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[2];
      dVar32 = local_630.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[2] * (double)local_6e8._0_8_ -
               local_6d8[0] *
               local_630.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[0];
      auVar25._8_8_ = dVar32;
      dVar31 = local_630.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[0] * (double)local_6e8._8_8_ -
               (double)local_6e8._0_8_ *
               local_630.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[1];
      dVar39 = dVar20 * dVar20 + dVar35 * dVar35 + auVar38._0_8_ * auVar38._0_8_;
      dVar35 = dVar31 * dVar31 + dVar32 * dVar32 + auVar25._0_8_ * auVar25._0_8_;
      local_718 = local_648.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                  m_data.array[0];
      uStack_710 = 0;
      local_768 = -local_648.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                   m_data.array[1];
      uStack_760 = 0x8000000000000000;
      local_758 = -local_630.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                   m_data.array[2];
      uStack_750 = 0x8000000000000000;
      local_728 = local_630.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                  m_data.array[0];
      uStack_720 = 0;
      local_748 = -local_630.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                   m_data.array[0];
      uStack_740 = 0x8000000000000000;
      auVar33._8_8_ = 0;
      auVar33._0_8_ = dVar39;
      auVar36 = sqrtpd(local_6e8,auVar33);
      auVar34._8_8_ = 0;
      auVar34._0_8_ = dVar35;
      auVar33 = sqrtpd(auVar34,auVar34);
      auVar37._0_8_ = auVar36._0_8_;
      auVar36._0_8_ = auVar33._0_8_;
      if (auVar37._0_8_ <= auVar36._0_8_) {
        if (0.0 < dVar35) {
          auVar36._8_8_ = auVar36._0_8_;
          auVar25 = divpd(auVar25,auVar36);
        }
        local_58 = (double)(~-(ulong)(0.0 < dVar35) & (ulong)dVar31 |
                           (ulong)(dVar31 / auVar36._0_8_) & -(ulong)(0.0 < dVar35));
      }
      else {
        if (0.0 < dVar39) {
          auVar37._8_8_ = auVar37._0_8_;
          auVar38 = divpd(auVar38,auVar37);
        }
        local_58 = (double)(~-(ulong)(0.0 < dVar39) & (ulong)dVar20 |
                           (ulong)(dVar20 / auVar37._0_8_) & -(ulong)(0.0 < dVar39));
        auVar25 = auVar38;
      }
      local_c0 = dVar23 + local_5e8 + local_5f8 + local_608 + local_618 + local_708;
      local_a8 = dVar29 + dStack_5e0 + dStack_5f0 + dStack_600 + dStack_610 + dStack_700;
      local_90 = local_7f8 + local_6f8;
      pdVar14 = &local_78;
      local_88 = auVar25._0_8_;
      local_70 = auVar25._8_8_;
      dStack_80 = (double)local_6e8._8_8_ * local_58 - local_70 * local_6d8[0];
      local_68 = local_6d8[0] * local_88 - local_58 * (double)local_6e8._0_8_;
      local_50 = local_70 * (double)local_6e8._0_8_ - local_88 * (double)local_6e8._8_8_;
      local_78 = (double)local_6e8._0_8_;
      local_60 = (double)local_6e8._8_8_;
      local_48 = local_6d8[0];
      local_7e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [0] = 1.0;
      local_7e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [1] = 0.0;
      local_7e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [2] = 0.0;
      local_7e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [3] = 0.0;
      local_7e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [4] = 0.0;
      local_7e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [5] = 1.0;
      local_7e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [6] = 0.0;
      local_7e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [7] = 0.0;
      local_7e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [8] = 0.0;
      dStack_7a0 = 0.0;
      local_798 = 1.0;
      dStack_790 = 0.0;
      dStack_788 = 0.0;
      local_780 = 0.0;
      uStack_778 = 0;
      local_770 = 0x3ff0000000000000;
      lVar12 = 0x10;
      do {
        dVar23 = pdVar14[-1];
        *(double *)((long)&local_7f8 + lVar12) = pdVar14[-2];
        *(double *)((long)&uStack_7f0 + lVar12) = dVar23;
        *(double *)
         ((long)local_7e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array + lVar12) = *pdVar14;
        pdVar14 = pdVar14 + 3;
        lVar12 = lVar12 + 0x20;
      } while (lVar12 != 0x70);
      auVar19._0_8_ =
           local_648.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[1] * local_90 +
           -local_648.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[2] * local_a8;
      dVar23 = local_648.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[2] * local_c0 +
               -local_648.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array[0] * local_90;
      auVar19._8_8_ = dVar23;
      dVar35 = local_648.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[0] * local_a8 +
               -local_648.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array[1] * local_c0;
      auVar30._0_8_ =
           local_630.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[1] * local_90 +
           -local_630.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[2] * local_a8;
      dVar29 = local_630.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[2] * local_c0 +
               -local_630.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array[0] * local_90;
      auVar30._8_8_ = dVar29;
      auVar24._0_8_ =
           -local_630.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[1] * local_c0;
      auVar24._8_8_ = 0x8000000000000000;
      dVar20 = local_630.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[0] * local_a8 + auVar24._0_8_;
      dVar23 = dVar35 * dVar35 + dVar23 * dVar23 + auVar19._0_8_ * auVar19._0_8_;
      auVar21._8_8_ = 0;
      auVar21._0_8_ = dVar23;
      auVar25 = sqrtpd(auVar24,auVar21);
      auVar27._0_8_ = dVar29 * dVar29 + auVar30._0_8_ * auVar30._0_8_;
      auVar27._8_8_ = dVar29 * dVar29;
      dVar29 = dVar20 * dVar20 + auVar27._0_8_;
      auVar22._8_8_ = 0;
      auVar22._0_8_ = dVar29;
      auVar33 = sqrtpd(auVar27,auVar22);
      auVar26._0_8_ = auVar25._0_8_;
      auVar28._0_8_ = auVar33._0_8_;
      if (auVar26._0_8_ <= auVar28._0_8_) {
        auVar19 = auVar30;
        if (0.0 < dVar29) {
          auVar28._8_8_ = auVar28._0_8_;
          auVar19 = divpd(auVar30,auVar28);
        }
        local_a0 = (double)(~-(ulong)(0.0 < dVar29) & (ulong)dVar20 |
                           (ulong)(dVar20 / auVar28._0_8_) & -(ulong)(0.0 < dVar29));
      }
      else {
        if (0.0 < dVar23) {
          auVar26._8_8_ = auVar26._0_8_;
          auVar19 = divpd(auVar19,auVar26);
        }
        local_a0 = (double)(~-(ulong)(0.0 < dVar23) & (ulong)dVar35 |
                           (ulong)(dVar35 / auVar26._0_8_) & -(ulong)(0.0 < dVar23));
      }
      pdVar14 = &local_c0;
      local_d0 = auVar19._0_8_;
      local_b8 = auVar19._8_8_;
      dStack_c8 = local_a8 * local_a0 - local_b8 * local_90;
      local_b0 = local_90 * local_d0 - local_a0 * local_c0;
      local_98 = local_b8 * local_c0 - local_d0 * local_a8;
      local_6c8 = 1.0;
      adStack_6c0[0] = 0.0;
      adStack_6c0[1] = 0.0;
      adStack_6c0[2] = 0.0;
      adStack_6c0[3] = 0.0;
      adStack_6c0[4] = 1.0;
      adStack_6c0[5] = 0.0;
      adStack_6c0[6] = 0.0;
      adStack_6c0[7] = 0.0;
      adStack_6c0[8] = 0.0;
      adStack_6c0[9] = 1.0;
      adStack_6c0[10] = 0.0;
      adStack_6c0[0xb] = 0.0;
      adStack_6c0[0xc] = 0.0;
      adStack_6c0[0xd] = 0.0;
      adStack_6c0[0xe] = 1.0;
      lVar12 = 0x10;
      do {
        dVar23 = pdVar14[-1];
        *(double *)((long)local_6d8 + lVar12) = pdVar14[-2];
        *(double *)((long)local_6d8 + lVar12 + 8) = dVar23;
        *(double *)((long)&local_6c8 + lVar12) = *pdVar14;
        pdVar14 = pdVar14 + 3;
        lVar12 = lVar12 + 0x20;
      } while (lVar12 != 0x70);
      lVar12 = 0;
      do {
        dVar23 = *(double *)((long)local_558 + lVar12 + 0x80);
        dVar29 = *(double *)((long)local_558 + lVar12 + 0x88);
        dVar20 = *(double *)((long)local_558 + lVar12 + 0x90);
        dVar35 = *(double *)((long)local_558 + lVar12 + 0x98);
        *(double *)
         ((long)local_218.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array + lVar12) =
             dStack_788 * dVar35 +
             local_7e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[8] * dVar20 +
             local_7e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[4] * dVar29 +
             local_7e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[0] * dVar23;
        *(double *)
         ((long)local_218.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array + lVar12 + 8) =
             local_780 * dVar35 +
             dStack_7a0 * dVar20 +
             local_7e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[5] * dVar29 +
             local_7e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[1] * dVar23;
        *(double *)
         ((long)local_218.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array + lVar12 + 0x10) =
             dVar35 * 0.0 +
             dVar20 * local_798 +
             dVar29 * local_7e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[6] +
             dVar23 * local_7e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[2];
        *(double *)
         ((long)local_218.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array + lVar12 + 0x18) =
             dVar35 * 1.0 +
             dVar20 * dStack_790 +
             dVar29 * local_7e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[7] +
             dVar23 * local_7e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[3];
        lVar12 = lVar12 + 0x20;
      } while (lVar12 != 0x80);
      lVar12 = 0;
      do {
        dVar23 = *(double *)((long)local_558 + lVar12);
        dVar29 = *(double *)((long)local_558 + lVar12 + 8);
        dVar20 = *(double *)((long)local_558 + lVar12 + 0x10);
        dVar35 = *(double *)((long)local_558 + lVar12 + 0x18);
        *(double *)
         ((long)local_158.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array + lVar12) =
             adStack_6c0[0xb] * dVar35 +
             adStack_6c0[7] * dVar20 + adStack_6c0[3] * dVar29 + local_6c8 * dVar23;
        *(double *)
         ((long)local_158.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array + lVar12 + 8) =
             adStack_6c0[0xc] * dVar35 +
             adStack_6c0[8] * dVar20 + adStack_6c0[4] * dVar29 + adStack_6c0[0] * dVar23;
        *(double *)
         ((long)local_158.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array + lVar12 + 0x10) =
             dVar35 * 0.0 +
             dVar20 * adStack_6c0[9] + dVar29 * adStack_6c0[5] + dVar23 * adStack_6c0[1];
        *(double *)
         ((long)local_158.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array + lVar12 + 0x18) =
             dVar35 * 1.0 +
             dVar20 * adStack_6c0[10] + dVar29 * adStack_6c0[6] + dVar23 * adStack_6c0[2];
        lVar12 = lVar12 + 0x20;
      } while (lVar12 != 0x80);
      (__return_storage_ptr__->
      super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
      )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
      )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pMVar2 = (__return_storage_ptr__->
               super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      if (pMVar2 == (pointer)0x0) {
        std::vector<Eigen::Matrix<double,4,4,0,4,4>,std::allocator<Eigen::Matrix<double,4,4,0,4,4>>>
        ::_M_realloc_insert<Eigen::Matrix<double,4,4,0,4,4>const&>
                  ((vector<Eigen::Matrix<double,4,4,0,4,4>,std::allocator<Eigen::Matrix<double,4,4,0,4,4>>>
                    *)__return_storage_ptr__,(iterator)0x0,&local_218);
      }
      else {
        pMVar15 = &local_218;
        pMVar16 = pMVar2;
        for (lVar12 = 0x10; lVar12 != 0; lVar12 = lVar12 + -1) {
          (pMVar16->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
          array[0] = (pMVar15->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
                     m_storage.m_data.array[0];
          pMVar15 = (Matrix<double,_4,_4,_0,_4,_4> *)((long)pMVar15 + ((ulong)bVar18 * -2 + 1) * 8);
          pMVar16 = (pointer)((long)pMVar16 + ((ulong)bVar18 * -2 + 1) * 8);
        }
        (__return_storage_ptr__->
        super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
        )._M_impl.super__Vector_impl_data._M_finish = pMVar2 + 1;
      }
      __position._M_current =
           (__return_storage_ptr__->
           super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->
          super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<Eigen::Matrix<double,4,4,0,4,4>,std::allocator<Eigen::Matrix<double,4,4,0,4,4>>>
        ::_M_realloc_insert<Eigen::Matrix<double,4,4,0,4,4>const&>
                  ((vector<Eigen::Matrix<double,4,4,0,4,4>,std::allocator<Eigen::Matrix<double,4,4,0,4,4>>>
                    *)__return_storage_ptr__,__position,&local_158);
      }
      else {
        pMVar15 = &local_158;
        iVar17._M_current = __position._M_current;
        for (lVar12 = 0x10; lVar12 != 0; lVar12 = lVar12 + -1) {
          ((iVar17._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
          m_storage.m_data.array[0] =
               (pMVar15->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
               m_data.array[0];
          pMVar15 = (Matrix<double,_4,_4,_0,_4,_4> *)((long)pMVar15 + ((ulong)bVar18 * -2 + 1) * 8);
          iVar17._M_current =
               (Matrix<double,_4,_4,_0,_4,_4> *)
               ((long)iVar17._M_current + ((ulong)bVar18 * -2 + 1) * 8);
        }
        (__return_storage_ptr__->
        super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
        )._M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      return __return_storage_ptr__;
    }
  }
  __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,
                "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 3, 1>>::finished() [MatrixType = Eigen::Matrix<double, 3, 1>]"
               );
}

Assistant:

vector<Matrix<floatPrec, 4,4>> getPredefinedTransformations1M1Q(Matrix<floatPrec, 6,1> l1, Matrix<floatPrec, 6,1> l2){

	// get closest point --in the line-- to the origin
	Eigen::Matrix<floatPrec,3,1> dir1 = l1.head(3), m1 = l1.tail(3);
	Eigen::Matrix<floatPrec,3,1> dir2 = l2.head(3), m2 = l2.tail(3);
	Eigen::Matrix<floatPrec,3,1> x1 = dir1.cross(m1);
	Eigen::Matrix<floatPrec,3,1> x2 = dir2.cross(m2);
	
	// get transform to translate frames to the line
	Eigen::Matrix<floatPrec,3,1> u1 = x1 - x1.transpose()*dir1*dir1;
	Eigen::Matrix<floatPrec,3,1> u2 = x2 - x2.transpose()*dir2*dir2;
	Eigen::Matrix<floatPrec,4,4> Tu1 = Eigen::Matrix<floatPrec,4,4>::Identity(), Tu2 = Eigen::Matrix<floatPrec,4,4>::Identity();
	Tu1.topRightCorner(3,1) = u1;
	Tu2.topRightCorner(3,1) = u2;
	Eigen::Matrix<floatPrec,6,6> TuL1 = Eigen::Matrix<floatPrec,6,6>::Identity(), TuL2 = Eigen::Matrix<floatPrec,6,6>::Identity();
	TuL1.block(3,0,3,3) = -getSkew<floatPrec>(u1);
	TuL2.block(3,0,3,3) = -getSkew<floatPrec>(u2);

	// transform point and line to new ref
	Eigen::Matrix<floatPrec,6,1> lu1 = TuL1*l1;
	Eigen::Matrix<floatPrec,6,1> lu2 = TuL2*l2;

	//align z axis with line direction
	Eigen::Matrix<floatPrec,3,1> U1_3 = lu1.head(3), U2_3 = lu2.head(3);
	Eigen::Matrix<floatPrec,3,1> ex, ey;
	ex << 1,0,0; ey << 0,1,0;
	Eigen::Matrix<floatPrec,3,1> U1_1, U2_1;
	// frame A
	Eigen::Matrix<floatPrec,3,1> U1_3M = ey.cross(U1_3);
	Eigen::Matrix<floatPrec,3,1> U1_3P = ex.cross(U1_3);
	if(U1_3M.norm() > U1_3P.norm())
		U1_1 = U1_3M.normalized();
	else
		U1_1 = U1_3P.normalized();
	Eigen::Matrix<floatPrec,3,3> U1;
	U1.row(0) = U1_1.transpose();
	U1.row(1) = U1_3.cross(U1_1).transpose();
	U1.row(2) = U1_3.transpose();
	Eigen::Matrix<floatPrec,4,4> TU1 = Eigen::Matrix<floatPrec,4,4>::Identity();
	TU1.topLeftCorner(3,3) = U1;
	Eigen::Matrix<floatPrec,6,6> TUL1 = Eigen::Matrix<floatPrec,6,6>::Identity();
	TUL1.topLeftCorner(3,3) = U1; TUL1.block(3,3,3,3) = U1;
	// frame B
	Eigen::Matrix<floatPrec,3,1> U2_3M = ey.cross(U2_3);
	Eigen::Matrix<floatPrec,3,1> U2_3P = ex.cross(U2_3);
	if(U2_3M.norm() > U2_3P.norm())
		U2_1 = U2_3M.normalized();
	else
		U2_1 = U2_3P.normalized();
	Eigen::Matrix<floatPrec,3,3> U2;
	U2.row(0) = U2_1.transpose();
	U2.row(1) = U2_3.cross(U2_1).transpose();
	U2.row(2) = U2_3.transpose();
	Eigen::Matrix<floatPrec,4,4> TU2 = Eigen::Matrix<floatPrec,4,4>::Identity();
	TU2.topLeftCorner(3,3) = U2;
	Eigen::Matrix<floatPrec,6,6> TUL2 = Eigen::Matrix<floatPrec,6,6>::Identity();
	TUL2.topLeftCorner(3,3) = U2; TUL2.block(3,3,3,3) = U2;

	Eigen::Matrix<floatPrec,4,4> TU = TU1*Tu1;
	Eigen::Matrix<floatPrec,4,4> TU_B = TU2*Tu2;

	std::vector<Eigen::Matrix<floatPrec,4,4>> trans;
	trans.push_back(TU);
	trans.push_back(TU_B);

	return trans;

}